

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O1

void N_VFreeEmpty(N_Vector v)

{
  if (v != (N_Vector)0x0) {
    if (v->ops != (N_Vector_Ops)0x0) {
      free(v->ops);
    }
    v->ops = (N_Vector_Ops)0x0;
    free(v);
    return;
  }
  return;
}

Assistant:

void N_VFreeEmpty(N_Vector v)
{
  if (v == NULL) { return; }

  /* free non-NULL ops structure */
  if (v->ops) { free(v->ops); }
  v->ops = NULL;

  /* free overall N_Vector object and return */
  free(v);

  return;
}